

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

int xmlAddEntity(xmlDocPtr doc,int extSubset,xmlChar *name,int type,xmlChar *ExternalID,
                xmlChar *SystemID,xmlChar *content,xmlEntityPtr *out)

{
  byte bVar1;
  _xmlDtd *p_Var2;
  xmlDictPtr dict;
  _xmlNode *p_Var3;
  int iVar4;
  xmlEntityPtr pxVar5;
  xmlHashTablePtr hash;
  uint uVar6;
  xmlChar ref_1 [4];
  xmlChar ref [4];
  
  if (out != (xmlEntityPtr *)0x0) {
    *out = (xmlEntityPtr)0x0;
  }
  if (name == (xmlChar *)0x0 || doc == (xmlDocPtr)0x0) {
    return 0x73;
  }
  p_Var2 = (&doc->intSubset)[extSubset != 0];
  if (p_Var2 == (_xmlDtd *)0x0) {
    return 0x20a;
  }
  dict = doc->dict;
  if (type - 1U < 3) {
    pxVar5 = xmlGetPredefinedEntity(name);
    if (pxVar5 != (xmlEntityPtr)0x0) {
      if (content == (xmlChar *)0x0 || type != 1) {
        return 0x75;
      }
      bVar1 = *pxVar5->content;
      uVar6 = (uint)bVar1;
      if ((((*content != bVar1) || (content[1] != '\0')) || (0x3e < uVar6)) ||
         ((0x4000008400000000U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
        if (*content != 0x26) {
          return 0x75;
        }
        if (content[1] != '#') {
          return 0x75;
        }
        if (content[2] == 'x') {
          ref[1] = "0123456789ABCDEF"[uVar6 & 0xf];
          ref[0] = "0123456789ABCDEF"[bVar1 >> 4];
          ref[2] = ';';
          ref[3] = '\0';
          iVar4 = xmlStrcasecmp(content + 3,ref);
          if (iVar4 != 0) {
            return 0x75;
          }
        }
        else {
          ref_1 = (xmlChar  [4])
                  (CONCAT22(0x3b,CONCAT11(bVar1 % 10,(char)((ushort)(bVar1 / 10) % 10)) | 0x30) |
                  0x3000);
          iVar4 = xmlStrEqual(content + 2,ref_1);
          if (iVar4 == 0) {
            return 0x75;
          }
        }
      }
    }
    hash = (xmlHashTablePtr)p_Var2->entities;
    if (hash != (xmlHashTablePtr)0x0) goto LAB_0012b11b;
    hash = xmlHashCreateDict(0,dict);
    p_Var2->entities = hash;
  }
  else {
    if (1 < type - 4U) {
      return 0x73;
    }
    hash = (xmlHashTablePtr)p_Var2->pentities;
    if (hash != (xmlHashTablePtr)0x0) goto LAB_0012b11b;
    hash = xmlHashCreateDict(0,dict);
    p_Var2->pentities = hash;
  }
  if (hash == (xmlHashTablePtr)0x0) {
    return 2;
  }
LAB_0012b11b:
  pxVar5 = xmlCreateEntity(p_Var2->doc,name,type,ExternalID,SystemID,content);
  if (pxVar5 != (xmlEntityPtr)0x0) {
    iVar4 = xmlHashAdd(hash,name,pxVar5);
    if (-1 < iVar4) {
      if (iVar4 == 0) {
        xmlFreeEntity(pxVar5);
        return 0x6b;
      }
      pxVar5->parent = p_Var2;
      pxVar5->doc = p_Var2->doc;
      p_Var3 = p_Var2->last;
      if (p_Var3 == (_xmlNode *)0x0) {
        p_Var2->children = (_xmlNode *)pxVar5;
      }
      else {
        p_Var3->next = (_xmlNode *)pxVar5;
        pxVar5->prev = p_Var3;
      }
      p_Var2->last = (_xmlNode *)pxVar5;
      if (out != (xmlEntityPtr *)0x0) {
        *out = pxVar5;
        return 0;
      }
      return 0;
    }
    xmlFreeEntity(pxVar5);
  }
  return 2;
}

Assistant:

int
xmlAddEntity(xmlDocPtr doc, int extSubset, const xmlChar *name, int type,
	  const xmlChar *ExternalID, const xmlChar *SystemID,
	  const xmlChar *content, xmlEntityPtr *out) {
    xmlDtdPtr dtd;
    xmlDictPtr dict = NULL;
    xmlEntitiesTablePtr table = NULL;
    xmlEntityPtr ret, predef;
    int res;

    if (out != NULL)
        *out = NULL;
    if ((doc == NULL) || (name == NULL))
	return(XML_ERR_ARGUMENT);
    dict = doc->dict;

    if (extSubset)
        dtd = doc->extSubset;
    else
        dtd = doc->intSubset;
    if (dtd == NULL)
        return(XML_DTD_NO_DTD);

    switch (type) {
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
            predef = xmlGetPredefinedEntity(name);
            if (predef != NULL) {
                int valid = 0;

                /* 4.6 Predefined Entities */
                if ((type == XML_INTERNAL_GENERAL_ENTITY) &&
                    (content != NULL)) {
                    int c = predef->content[0];

                    if (((content[0] == c) && (content[1] == 0)) &&
                        ((c == '>') || (c == '\'') || (c == '"'))) {
                        valid = 1;
                    } else if ((content[0] == '&') && (content[1] == '#')) {
                        if (content[2] == 'x') {
                            xmlChar *hex = BAD_CAST "0123456789ABCDEF";
                            xmlChar ref[] = "00;";

                            ref[0] = hex[c / 16 % 16];
                            ref[1] = hex[c % 16];
                            if (xmlStrcasecmp(&content[3], ref) == 0)
                                valid = 1;
                        } else {
                            xmlChar ref[] = "00;";

                            ref[0] = '0' + c / 10 % 10;
                            ref[1] = '0' + c % 10;
                            if (xmlStrEqual(&content[2], ref))
                                valid = 1;
                        }
                    }
                }
                if (!valid)
                    return(XML_ERR_REDECL_PREDEF_ENTITY);
            }
	    if (dtd->entities == NULL) {
		dtd->entities = xmlHashCreateDict(0, dict);
                if (dtd->entities == NULL)
                    return(XML_ERR_NO_MEMORY);
            }
	    table = dtd->entities;
	    break;
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
	    if (dtd->pentities == NULL) {
		dtd->pentities = xmlHashCreateDict(0, dict);
                if (dtd->pentities == NULL)
                    return(XML_ERR_NO_MEMORY);
            }
	    table = dtd->pentities;
	    break;
        default:
	    return(XML_ERR_ARGUMENT);
    }
    ret = xmlCreateEntity(dtd->doc, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(XML_ERR_NO_MEMORY);

    res = xmlHashAdd(table, name, ret);
    if (res < 0) {
        xmlFreeEntity(ret);
        return(XML_ERR_NO_MEMORY);
    } else if (res == 0) {
	/*
	 * entity was already defined at another level.
	 */
        xmlFreeEntity(ret);
	return(XML_WAR_ENTITY_REDEFINED);
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    ret->doc = dtd->doc;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
	dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }

    if (out != NULL)
        *out = ret;
    return(0);
}